

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,GenericForStatement *gen_for,void *data)

{
  pointer pSVar1;
  undefined8 in_RSI;
  function<void_()> *in_RDI;
  NameListData name_list_data;
  Guard g;
  ExpListData exp_list_data;
  Guard l;
  SyntaxTree *old_loop;
  Guard *this_00;
  anon_class_16_2_c9614607 *in_stack_fffffffffffffeb8;
  function<void_()> *enter;
  Guard *this_01;
  NameListData local_128 [2];
  anon_class_8_1_8991fb9c local_118 [5];
  Guard local_f0 [2];
  ExpListData local_b0 [6];
  SyntaxTree *local_98;
  Guard local_90;
  undefined8 local_68;
  function<void_()> local_60 [2];
  SyntaxTree *local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  local_20 = GetLoopAST((SemanticAnalysisVisitor *)in_RDI);
  local_68 = local_10;
  enter = local_60;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::GenericForStatement*,void*)::__0,void>
            (in_RDI,in_stack_fffffffffffffeb8);
  local_98 = local_20;
  this_01 = &local_90;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::GenericForStatement*,void*)::__1,void>
            (in_RDI,(anon_class_16_2_3ebab7f7 *)in_stack_fffffffffffffeb8);
  Guard::Guard(this_01,enter,in_RDI);
  std::function<void_()>::~function((function<void_()> *)0x1e4640);
  std::function<void_()>::~function((function<void_()> *)0x1e464d);
  ExpListData::ExpListData(local_b0);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1e466d);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,local_b0);
  this_00 = local_f0;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::GenericForStatement*,void*)::__2,void>
            (in_RDI,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffeb8);
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::GenericForStatement*,void*)::__3,void>
            (in_RDI,local_118);
  Guard::Guard(this_01,enter,in_RDI);
  std::function<void_()>::~function((function<void_()> *)0x1e46e7);
  std::function<void_()>::~function((function<void_()> *)0x1e46f1);
  NameListData::NameListData(local_128);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1e470e);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,local_128);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1e4737);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,0);
  Guard::~Guard(this_00);
  Guard::~Guard(this_00);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(GenericForStatement *gen_for, void *data)
    {
        SEMANTIC_ANALYSIS_LOOP_GUARD(gen_for);
        ExpListData exp_list_data;
        gen_for->exp_list_->Accept(this, &exp_list_data);

        SEMANTIC_ANALYSIS_GUARD(EnterBlock, LeaveBlock);
        NameListData name_list_data;
        gen_for->name_list_->Accept(this, &name_list_data);
        gen_for->block_->Accept(this, nullptr);
    }